

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock25(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  uint32_t *puVar15;
  uint uVar16;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  puVar15 = *pout;
  *pw = (uint8_t *)((long)puVar1 + 100);
  *puVar15 = ((uint)uVar2 & 0x1ffffff) + base;
  puVar15[1] = ((uint)(uVar2 >> 0x19) & 0x1ffffff) + base;
  puVar15[2] = ((uint)(uVar3 << 0xe) & 0x1ffffff | (uint)(uVar2 >> 0x32)) + base;
  puVar15[3] = ((uint)(uVar3 >> 0xb) & 0x1ffffff) + base;
  uVar16 = (uint)(uVar3 >> 0x20);
  puVar15[4] = (uVar16 >> 4 & 0x1ffffff) + base;
  puVar15[5] = ((uint)(uVar4 << 3) & 0x1ffffff | uVar16 >> 0x1d) + base;
  puVar15[6] = ((uint)(uVar4 >> 0x16) & 0x1ffffff) + base;
  puVar15[7] = ((uint)(uVar5 << 0x11) & 0x1ffffff | (uint)(uVar4 >> 0x2f)) + base;
  puVar15[8] = ((uint)(uVar5 >> 8) & 0x1ffffff) + base;
  uVar16 = (uint)(uVar5 >> 0x20);
  puVar15[0xd] = ((uint)(uVar7 >> 5) & 0x1ffffff) + base;
  puVar15[0xe] = ((uint)(uVar7 >> 0x1e) & 0x1ffffff) + base;
  puVar15[0xf] = ((uint)(uVar8 << 9) & 0x1ffffff | (uint)(uVar7 >> 0x37)) + base;
  puVar15[0x10] = ((uint)(uVar8 >> 0x10) & 0x1ffffff) + base;
  puVar15[9] = (uVar16 >> 1 & 0x1ffffff) + base;
  puVar15[10] = ((uint)(uVar6 << 6) & 0x1ffffff | uVar16 >> 0x1a) + base;
  puVar15[0xb] = ((uint)(uVar6 >> 0x13) & 0x1ffffff) + base;
  puVar15[0xc] = ((uint)(uVar7 << 0x14) & 0x1ffffff | (uint)(uVar6 >> 0x2c)) + base;
  puVar15[0x11] = ((uint)(uVar8 >> 0x29) | (uint)(uVar9 << 0x17) & 0x1ffffff) + base;
  puVar15[0x12] = ((uint)(uVar9 >> 2) & 0x1ffffff) + base;
  puVar15[0x13] = ((uint)(uVar9 >> 0x1b) & 0x1ffffff) + base;
  puVar15[0x14] = ((uint)(uVar10 << 0xc) & 0x1ffffff | (uint)(uVar9 >> 0x34)) + base;
  puVar15[0x15] = ((uint)(uVar10 >> 0xd) & 0x1ffffff) + base;
  uVar16 = (uint)(uVar10 >> 0x20);
  puVar15[0x16] = (uVar16 >> 6 & 0x1ffffff) + base;
  puVar15[0x17] = ((uint)(uVar11 << 1) & 0x1ffffff | uVar16 >> 0x1f) + base;
  puVar15[0x18] = ((uint)(uVar11 >> 0x18) & 0x1ffffff) + base;
  puVar15[0x19] = ((uint)(uVar12 << 0xf) & 0x1ffffff | (uint)(uVar11 >> 0x31)) + base;
  uVar16 = (uint)(uVar12 >> 0x20);
  puVar15[0x1a] = ((uint)(uVar12 >> 10) & 0x1ffffff) + base;
  puVar15[0x1b] = (uVar16 >> 3 & 0x1ffffff) + base;
  puVar15[0x1c] = ((uint)(uVar13 << 4) & 0x1ffffff | uVar16 >> 0x1c) + base;
  puVar15[0x1d] = ((uint)(uVar13 >> 0x15) & 0x1ffffff) + base;
  puVar15[0x1e] = ((uint)(uVar14 << 0x12) & 0x1ffffff | (uint)(uVar13 >> 0x2e)) + base;
  puVar15[0x1f] = ((uint)(uVar14 >> 7) & 0x1ffffff) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock25(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(33554431);
  /* we are going to access  13 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  *pw += 100; /* we used up 100 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 25) & mask);
  out[2] = base + (uint32_t)(((w0 >> 50) | (w1 << 14)) & mask);
  out[3] = base + (uint32_t)((w1 >> 11) & mask);
  out[4] = base + (uint32_t)((w1 >> 36) & mask);
  out[5] = base + (uint32_t)(((w1 >> 61) | (w2 << 3)) & mask);
  out[6] = base + (uint32_t)((w2 >> 22) & mask);
  out[7] = base + (uint32_t)(((w2 >> 47) | (w3 << 17)) & mask);
  out[8] = base + (uint32_t)((w3 >> 8) & mask);
  out[9] = base + (uint32_t)((w3 >> 33) & mask);
  out[10] = base + (uint32_t)(((w3 >> 58) | (w4 << 6)) & mask);
  out[11] = base + (uint32_t)((w4 >> 19) & mask);
  out[12] = base + (uint32_t)(((w4 >> 44) | (w5 << 20)) & mask);
  out[13] = base + (uint32_t)((w5 >> 5) & mask);
  out[14] = base + (uint32_t)((w5 >> 30) & mask);
  out[15] = base + (uint32_t)(((w5 >> 55) | (w6 << 9)) & mask);
  out[16] = base + (uint32_t)((w6 >> 16) & mask);
  out[17] = base + (uint32_t)(((w6 >> 41) | (w7 << 23)) & mask);
  out[18] = base + (uint32_t)((w7 >> 2) & mask);
  out[19] = base + (uint32_t)((w7 >> 27) & mask);
  out[20] = base + (uint32_t)(((w7 >> 52) | (w8 << 12)) & mask);
  out[21] = base + (uint32_t)((w8 >> 13) & mask);
  out[22] = base + (uint32_t)((w8 >> 38) & mask);
  out[23] = base + (uint32_t)(((w8 >> 63) | (w9 << 1)) & mask);
  out[24] = base + (uint32_t)((w9 >> 24) & mask);
  out[25] = base + (uint32_t)(((w9 >> 49) | (w10 << 15)) & mask);
  out[26] = base + (uint32_t)((w10 >> 10) & mask);
  out[27] = base + (uint32_t)((w10 >> 35) & mask);
  out[28] = base + (uint32_t)(((w10 >> 60) | (w11 << 4)) & mask);
  out[29] = base + (uint32_t)((w11 >> 21) & mask);
  out[30] = base + (uint32_t)(((w11 >> 46) | (w12 << 18)) & mask);
  out[31] = base + (uint32_t)((w12 >> 7) & mask);
  *pout += 32; /* we wrote 32 32-bit integers */
}